

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O3

void __thiscall wasm::DataFlow::Printer::warnOnSuspiciousValues(Printer *this,Node *node)

{
  pointer ppNVar1;
  key_type pNVar2;
  Function *pFVar3;
  Node *pNVar4;
  bool bVar5;
  int iVar6;
  iterator iVar7;
  ostream *poVar8;
  key_type *in_RCX;
  long lVar9;
  char *pcVar10;
  pointer ppNVar11;
  Name name;
  key_type local_40;
  Node *local_38;
  
  iVar6 = debug();
  if (iVar6 == 0) {
    __assert_fail("debug()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                  ,0x2a5,"void wasm::DataFlow::Printer::warnOnSuspiciousValues(Node *)");
  }
  ppNVar11 = (node->values).
             super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppNVar1 = (node->values).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_38 = node;
  if (ppNVar11 != ppNVar1) {
    do {
      pNVar2 = *ppNVar11;
      local_40 = pNVar2;
      iVar7 = std::
              _Hashtable<wasm::DataFlow::Node_*,_std::pair<wasm::DataFlow::Node_*const,_std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>,_std::allocator<std::pair<wasm::DataFlow::Node_*const,_std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::DataFlow::Node_*>,_std::hash<wasm::DataFlow::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->trace->replacements)._M_h,&local_40);
      in_RCX = (key_type *)
               ((long)iVar7.
                      super__Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>,_false>
                      ._M_cur + 0x10);
      if (iVar7.
          super__Node_iterator_base<std::pair<wasm::DataFlow::Node_*const,_std::unique_ptr<wasm::DataFlow::Node,_std::default_delete<wasm::DataFlow::Node>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        in_RCX = &local_40;
      }
      if (pNVar2 != *in_RCX) {
        return;
      }
      ppNVar11 = ppNVar11 + 1;
    } while (ppNVar11 != ppNVar1);
  }
  pNVar4 = local_38;
  bVar5 = allInputsIdentical(local_38);
  if (bVar5) {
    pcVar10 = "^^ suspicious identical inputs! missing optimization in ";
    lVar9 = 0x38;
  }
  else {
    if (pNVar4->type == Phi) {
      return;
    }
    bVar5 = allInputsConstant(local_38);
    if (!bVar5) {
      return;
    }
    pcVar10 = "^^ suspicious constant inputs! missing optimization in ";
    lVar9 = 0x37;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar9);
  pFVar3 = this->graph->func;
  name.super_IString.str._M_str = (char *)in_RCX;
  name.super_IString.str._M_len =
       (size_t)(pFVar3->super_Importable).super_Named.name.super_IString.str._M_str;
  poVar8 = wasm::operator<<((wasm *)&std::cout,
                            (ostream *)
                            (pFVar3->super_Importable).super_Named.name.super_IString.str._M_len,
                            name);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"? ^^\n",5);
  return;
}

Assistant:

void warnOnSuspiciousValues(Node* node) {
    assert(debug());
    // If the node has no uses, it's not interesting enough to be
    // suspicious. TODO
    // If an input was replaced with a var, then we should not
    // look into it, it's not suspiciously trivial.
    for (auto* value : node->values) {
      if (value != getMaybeReplaced(value)) {
        return;
      }
    }
    if (allInputsIdentical(node)) {
      std::cout << "^^ suspicious identical inputs! missing optimization in "
                << graph.func->name << "? ^^\n";
      return;
    }
    if (!node->isPhi() && allInputsConstant(node)) {
      std::cout << "^^ suspicious constant inputs! missing optimization in "
                << graph.func->name << "? ^^\n";
      return;
    }
  }